

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

spvc_result
spvc_context_parse_spirv
          (spvc_context context,SpvId *spirv,size_t word_count,spvc_parsed_ir *parsed_ir)

{
  spvc_result sVar1;
  spvc_parsed_ir_s *this;
  _Head_base<0UL,_ScratchMemoryAllocation_*,_false> local_878;
  string local_870;
  Parser parser;
  
  this = (spvc_parsed_ir_s *)operator_new(0x790,(nothrow_t *)&std::nothrow);
  if (this == (spvc_parsed_ir_s *)0x0) {
    std::__cxx11::string::string((string *)&local_870,"Out of memory.",(allocator *)&parser);
    spvc_context_s::report_error(context,&local_870);
    std::__cxx11::string::~string((string *)&local_870);
    sVar1 = SPVC_ERROR_OUT_OF_MEMORY;
  }
  else {
    spvc_parsed_ir_s::spvc_parsed_ir_s(this);
    this->context = context;
    spirv_cross::Parser::Parser(&parser,spirv,word_count);
    spirv_cross::Parser::parse(&parser);
    spirv_cross::ParsedIR::operator=(&this->parsed,&parser.ir);
    *parsed_ir = this;
    local_878._M_head_impl = (ScratchMemoryAllocation *)this;
    spirv_cross::
    SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
    ::push_back(&context->allocations,
                (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>
                 *)&local_878);
    if ((spvc_parsed_ir_s *)local_878._M_head_impl != (spvc_parsed_ir_s *)0x0) {
      (*((ScratchMemoryAllocation *)&(local_878._M_head_impl)->_vptr_ScratchMemoryAllocation)->
        _vptr_ScratchMemoryAllocation[1])();
    }
    spirv_cross::Parser::~Parser(&parser);
    sVar1 = SPVC_SUCCESS;
  }
  return sVar1;
}

Assistant:

spvc_result spvc_context_parse_spirv(spvc_context context, const SpvId *spirv, size_t word_count,
                                     spvc_parsed_ir *parsed_ir)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		std::unique_ptr<spvc_parsed_ir_s> pir(new (std::nothrow) spvc_parsed_ir_s);
		if (!pir)
		{
			context->report_error("Out of memory.");
			return SPVC_ERROR_OUT_OF_MEMORY;
		}

		pir->context = context;
		Parser parser(spirv, word_count);
		parser.parse();
		pir->parsed = std::move(parser.get_parsed_ir());
		*parsed_ir = pir.get();
		context->allocations.push_back(std::move(pir));
	}